

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevT.cpp
# Opt level: O2

void __thiscall OpenMD::ChebyshevT::GeneratePolynomials(ChebyshevT *this,int maxPower)

{
  vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *this_00;
  long lVar1;
  long lVar2;
  DoublePolynomial cn;
  DoublePolynomial twoX;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  GenerateFirstTwoTerms(this);
  twoX.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &twoX.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header;
  twoX.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  twoX.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  twoX.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cn.polyPairMap_._M_t._M_impl._0_8_ = 0x4000000000000000;
  twoX.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       twoX.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Polynomial<double>::setCoefficient(&twoX,1,(double *)&cn);
  this_00 = &this->polyList_;
  lVar2 = 0;
  for (lVar1 = 2; lVar1 <= maxPower; lVar1 = lVar1 + 1) {
    cn.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    cn.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    cn.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cn.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header;
    cn.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cn.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         cn.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    operator*((Polynomial<double> *)&local_90,
              (Polynomial<double> *)
              ((long)&(this_00->
                      super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[1].polyPairMap_._M_t._M_impl +
              lVar2),&twoX);
    operator-((Polynomial<double> *)&local_60,(Polynomial<double> *)&local_90,
              (Polynomial<double> *)
              ((long)&(((this_00->
                        super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->polyPairMap_)._M_t._M_impl +
              lVar2));
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::operator=((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)&cn,&local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_90);
    std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
              (this_00,(value_type *)&cn);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)&cn);
    lVar2 = lVar2 + 0x30;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)&twoX);
  return;
}

Assistant:

void ChebyshevT::GeneratePolynomials(int maxPower) {
    GenerateFirstTwoTerms();

    DoublePolynomial twoX;
    twoX.setCoefficient(1, 2.0);

    // recursive generate the high order term of Chebyshev Polynomials
    // Cn+1(x) = Cn(x) * 2x - Cn-1(x)
    for (int i = 2; i <= maxPower; ++i) {
      DoublePolynomial cn;

      cn = polyList_[i - 1] * twoX - polyList_[i - 2];
      polyList_.push_back(cn);
    }
  }